

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.hpp
# Opt level: O2

data_ptr_t duckdb::ARTKey::CreateData<long>(ArenaAllocator *allocator,long value)

{
  ulong *puVar1;
  
  puVar1 = (ulong *)ArenaAllocator::Allocate(allocator,8);
  *puVar1 = (ulong)value >> 0x38 | (value & 0xff000000000000U) >> 0x28 |
            (value & 0xff0000000000U) >> 0x18 | (value & 0xff00000000U) >> 8 |
            (value & 0xff000000U) << 8 | (value & 0xff0000U) << 0x18 | (value & 0xff00U) << 0x28 |
            value << 0x38;
  *(data_t *)puVar1 = (char)((ulong)value >> 0x38) + 0x80;
  return (data_ptr_t)puVar1;
}

Assistant:

static inline data_ptr_t CreateData(ArenaAllocator &allocator, T value) {
		auto data = allocator.Allocate(sizeof(value));
		Radix::EncodeData<T>(data, value);
		return data;
	}